

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManDumpVerilog(Gia_Man_t *p,char *pFileName,Vec_Int_t *vObjs)

{
  int d;
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *__s;
  Vec_Bit_t *p_00;
  Vec_Bit_t *p_01;
  size_t sVar4;
  ushort **ppuVar5;
  Gia_Obj_t *pGVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  int v;
  
  d = Abc_Base10Log(p->nObjs);
  iVar3 = p->nRegs;
  iVar1 = Abc_Base10Log(p->vCis->nSize - iVar3);
  if (iVar3 != 0) {
    puts("Currently cannot write sequential AIG.");
    return;
  }
  __s = fopen(pFileName,"wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  lVar9 = 0;
  p_00 = Gia_ManGenUsed(p,0);
  p_01 = Gia_ManGenUsed(p,1);
  fwrite("module ",7,1,__s);
  while( true ) {
    pcVar7 = p->pName;
    sVar4 = strlen(pcVar7);
    if ((int)sVar4 <= lVar9) break;
    ppuVar5 = __ctype_b_loc();
    iVar2 = (int)pcVar7[lVar9];
    iVar3 = 0x5f;
    if (((*ppuVar5)[iVar2] & 0xc00) != 0) {
      iVar3 = iVar2;
    }
    fputc(iVar3,__s);
    lVar9 = lVar9 + 1;
  }
  fwrite(" (\n    ",7,1,__s);
  Gia_ManWriteNames((FILE *)__s,'x',p->vCis->nSize - p->nRegs,p->vNamesIn,4,4,(Vec_Bit_t *)0x0);
  fwrite(",\n    ",6,1,__s);
  Gia_ManWriteNames((FILE *)__s,'z',p->vCos->nSize - p->nRegs,p->vNamesOut,4,4,(Vec_Bit_t *)0x0);
  fwrite("\n  );\n\n",7,1,__s);
  fwrite("  input ",8,1,__s);
  Gia_ManWriteNames((FILE *)__s,'x',p->vCis->nSize - p->nRegs,p->vNamesIn,8,4,(Vec_Bit_t *)0x0);
  fwrite(";\n\n",3,1,__s);
  fwrite("  output ",9,1,__s);
  Gia_ManWriteNames((FILE *)__s,'z',p->vCos->nSize - p->nRegs,p->vNamesOut,9,4,(Vec_Bit_t *)0x0);
  fwrite(";\n\n",3,1,__s);
  iVar3 = Vec_BitCount(p_01);
  if (iVar3 != 0) {
    fwrite("  wire ",7,1,__s);
    Gia_ManWriteNames((FILE *)__s,'n',p->nObjs,(Vec_Ptr_t *)0x0,7,4,p_01);
    fwrite(";\n\n",3,1,__s);
  }
  iVar3 = Vec_BitCount(p_00);
  if (iVar3 != 0) {
    fwrite("  wire ",7,1,__s);
    Gia_ManWriteNames((FILE *)__s,'i',p->nObjs,(Vec_Ptr_t *)0x0,7,4,p_00);
    fwrite(";\n\n",3,1,__s);
  }
  if (vObjs != (Vec_Int_t *)0x0) {
    fwrite("  wire ",7,1,__s);
    for (uVar8 = 0; (int)uVar8 < vObjs->nSize; uVar8 = uVar8 + 1) {
      Vec_IntEntry(vObjs,uVar8);
      pcVar7 = ",";
      if (uVar8 == vObjs->nSize - 1U) {
        pcVar7 = "";
      }
      fprintf(__s," t_%d%s",(ulong)uVar8,pcVar7);
    }
    fwrite(";\n\n",3,1,__s);
    for (uVar8 = 0; (int)uVar8 < vObjs->nSize; uVar8 = uVar8 + 1) {
      iVar3 = Vec_IntEntry(vObjs,uVar8);
      Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,'n',iVar3,d);
      fprintf(__s,"  buf( %s,",Gia_ObjGetDumpName::pBuffer);
      fprintf(__s," t_%d );\n",(ulong)uVar8);
    }
    fputc(10,__s);
  }
  for (iVar3 = 0; iVar3 < p->vCis->nSize - p->nRegs; iVar3 = iVar3 + 1) {
    pGVar6 = Gia_ManCi(p,iVar3);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(p,pGVar6);
    iVar2 = Vec_BitEntry(p_01,iVar2);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjId(p,pGVar6);
      Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,'n',iVar2,d);
      fprintf(__s,"  buf( %s,",Gia_ObjGetDumpName::pBuffer);
      Gia_ObjGetDumpName(p->vNamesIn,'x',iVar3,iVar1);
      fprintf(__s," %s );\n",Gia_ObjGetDumpName::pBuffer);
    }
    iVar2 = Gia_ObjId(p,pGVar6);
    iVar2 = Vec_BitEntry(p_00,iVar2);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjId(p,pGVar6);
      Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,'i',iVar2,d);
      fprintf(__s,"  not( %s,",Gia_ObjGetDumpName::pBuffer);
      Gia_ObjGetDumpName(p->vNamesIn,'x',iVar3,iVar1);
      fprintf(__s," %s );\n",Gia_ObjGetDumpName::pBuffer);
    }
  }
  fputc(10,__s);
  for (iVar3 = 0; iVar3 < p->nObjs; iVar3 = iVar3 + 1) {
    pGVar6 = Gia_ManObj(p,iVar3);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
      if (vObjs == (Vec_Int_t *)0x0) {
LAB_001fb197:
        Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,'n',iVar3,d);
        fprintf(__s,"  and( %s,",Gia_ObjGetDumpName::pBuffer);
        Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,((*(uint *)pGVar6 >> 0x1d & 1) == 0) * '\x05' + 'i',
                           iVar3 - (*(uint *)pGVar6 & 0x1fffffff),d);
        fprintf(__s," %s,",Gia_ObjGetDumpName::pBuffer);
        Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,((*(ulong *)pGVar6 >> 0x3d & 1) == 0) * '\x05' + 'i',
                           iVar3 - ((uint)(*(ulong *)pGVar6 >> 0x20) & 0x1fffffff),d);
        fprintf(__s," %s );\n",Gia_ObjGetDumpName::pBuffer);
      }
      else {
        for (iVar1 = 0; iVar2 = vObjs->nSize, iVar1 < iVar2; iVar1 = iVar1 + 1) {
          iVar2 = Vec_IntEntry(vObjs,iVar1);
          if (iVar2 == iVar3) {
            iVar2 = vObjs->nSize;
            break;
          }
        }
        if (iVar2 <= iVar1) goto LAB_001fb197;
      }
      iVar1 = Vec_BitEntry(p_00,iVar3);
      if (iVar1 != 0) {
        Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,'i',iVar3,d);
        fprintf(__s,"  not( %s,",Gia_ObjGetDumpName::pBuffer);
        Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,'n',iVar3,d);
        fprintf(__s," %s );\n",Gia_ObjGetDumpName::pBuffer);
      }
    }
  }
  fputc(10,__s);
  iVar3 = p->vCos->nSize;
  iVar1 = p->nRegs;
  iVar2 = Abc_Base10Log(iVar3 - iVar1);
  for (v = 0; v < iVar3 - iVar1; v = v + 1) {
    pGVar6 = Gia_ManCo(p,v);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    Gia_ObjGetDumpName(p->vNamesOut,'z',v,iVar2);
    fprintf(__s,"  buf( %s, ",Gia_ObjGetDumpName::pBuffer);
    uVar8 = (uint)*(ulong *)pGVar6;
    if ((~*(ulong *)(pGVar6 + -(ulong)(uVar8 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0) {
      fprintf(__s,"1\'b%d );\n",(ulong)((uint)(*(ulong *)pGVar6 >> 0x1d) & 1));
    }
    else {
      iVar3 = Gia_ObjFaninId0p(p,pGVar6);
      Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,((uVar8 >> 0x1d & 1) == 0) * '\x05' + 'i',iVar3,d);
      fprintf(__s,"%s );\n",Gia_ObjGetDumpName::pBuffer);
    }
    iVar3 = p->vCos->nSize;
    iVar1 = p->nRegs;
  }
  fwrite("\nendmodule\n\n",0xc,1,__s);
  fclose(__s);
  Vec_BitFree(p_00);
  Vec_BitFree(p_01);
  return;
}

Assistant:

void Gia_ManDumpVerilog( Gia_Man_t * p, char * pFileName, Vec_Int_t * vObjs )
{
    FILE * pFile;
    Gia_Obj_t * pObj;
    Vec_Bit_t * vInvs, * vUsed;
    int nDigits = Abc_Base10Log( Gia_ManObjNum(p) );
    int nDigits2 = Abc_Base10Log( Gia_ManPiNum(p) );
    int i, k, iObj;
    if ( Gia_ManRegNum(p) )
    {
        printf( "Currently cannot write sequential AIG.\n" );
        return;
    }
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }

    vInvs = Gia_ManGenUsed( p, 0 );
    vUsed = Gia_ManGenUsed( p, 1 );

    //fprintf( pFile, "// This Verilog file is written by ABC on %s\n\n", Extra_TimeStamp() );

    fprintf( pFile, "module " );
    for ( i = 0; i < (int)strlen(p->pName); i++ )
        if ( isalpha(p->pName[i]) || isdigit(p->pName[i]) )
            fprintf( pFile, "%c", p->pName[i] );
        else
            fprintf( pFile, "_" );
    fprintf( pFile, " (\n    " );
    Gia_ManWriteNames( pFile, 'x', Gia_ManPiNum(p), p->vNamesIn, 4, 4, NULL );
    fprintf( pFile, ",\n    " );

    Gia_ManWriteNames( pFile, 'z', Gia_ManPoNum(p), p->vNamesOut, 4, 4, NULL );
    fprintf( pFile, "\n  );\n\n" );

    fprintf( pFile, "  input " );
    Gia_ManWriteNames( pFile, 'x', Gia_ManPiNum(p), p->vNamesIn, 8, 4, NULL );
    fprintf( pFile, ";\n\n" );

    fprintf( pFile, "  output " );
    Gia_ManWriteNames( pFile, 'z', Gia_ManPoNum(p), p->vNamesOut, 9, 4, NULL );
    fprintf( pFile, ";\n\n" );

    if ( Vec_BitCount(vUsed) )
    {
        fprintf( pFile, "  wire " );
        Gia_ManWriteNames( pFile, 'n', Gia_ManObjNum(p), NULL, 7, 4, vUsed );
        fprintf( pFile, ";\n\n" );
    }

    if ( Vec_BitCount(vInvs) )
    {
        fprintf( pFile, "  wire " );
        Gia_ManWriteNames( pFile, 'i', Gia_ManObjNum(p), NULL, 7, 4, vInvs );
        fprintf( pFile, ";\n\n" );
    }

    if ( vObjs )
    {
        fprintf( pFile, "  wire " );
        Vec_IntForEachEntry( vObjs, iObj, i )
            fprintf( pFile, " t_%d%s", i, i==Vec_IntSize(vObjs)-1 ? "" : "," ); 
        fprintf( pFile, ";\n\n" );
        Vec_IntForEachEntry( vObjs, iObj, i )
        {
            fprintf( pFile, "  buf( %s,", Gia_ObjGetDumpName(NULL, 'n', iObj, nDigits) );
            fprintf( pFile, " t_%d );\n", i );
        }
        fprintf( pFile, "\n" );
    }

    // input inverters
    Gia_ManForEachPi( p, pObj, i )
    {
        if ( Vec_BitEntry(vUsed, Gia_ObjId(p, pObj)) )
        {
            fprintf( pFile, "  buf( %s,", Gia_ObjGetDumpName(NULL, 'n', Gia_ObjId(p, pObj), nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(p->vNamesIn, 'x', i, nDigits2) );
        }
        if ( Vec_BitEntry(vInvs, Gia_ObjId(p, pObj)) )
        {
            fprintf( pFile, "  not( %s,", Gia_ObjGetDumpName(NULL, 'i', Gia_ObjId(p, pObj), nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(p->vNamesIn, 'x', i, nDigits2) );
        }
    }

    // internal nodes and their inverters
    fprintf( pFile, "\n" );
    Gia_ManForEachAnd( p, pObj, i )
    {
        int fSkip = 0;
        if ( vObjs )
        {
            Vec_IntForEachEntry( vObjs, iObj, k )
                if ( iObj == i )
                    break;
            if ( k < Vec_IntSize(vObjs) )
                fSkip = 1;
        }
        if ( !fSkip )
        {
            fprintf( pFile, "  and( %s,", Gia_ObjGetDumpName(NULL, 'n', i, nDigits) );
            fprintf( pFile, " %s,",       Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC0(pObj)? 'i':'n'), Gia_ObjFaninId0(pObj, i), nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC1(pObj)? 'i':'n'), Gia_ObjFaninId1(pObj, i), nDigits) );
        }
        if ( Vec_BitEntry(vInvs, i) )
        {
            fprintf( pFile, "  not( %s,", Gia_ObjGetDumpName(NULL, 'i', i, nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(NULL, 'n', i, nDigits) );
        }
    }
    
    // output drivers
    fprintf( pFile, "\n" );
    nDigits2 = Abc_Base10Log( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
/*
        fprintf( pFile, "  assign %s = ", Gia_ObjGetDumpName(p->vNamesOut, 'z', i, nDigits2) );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            fprintf( pFile, "1\'b%d;\n", Gia_ObjFaninC0(pObj) );
        else 
            fprintf( pFile, "%s;\n", Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC0(pObj)? 'i':'n'), Gia_ObjFaninId0p(p, pObj), nDigits) );
*/
        fprintf( pFile, "  buf( %s, ", Gia_ObjGetDumpName(p->vNamesOut, 'z', i, nDigits2) );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            fprintf( pFile, "1\'b%d );\n", Gia_ObjFaninC0(pObj) );
        else 
            fprintf( pFile, "%s );\n", Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC0(pObj)? 'i':'n'), Gia_ObjFaninId0p(p, pObj), nDigits) );
    }

    fprintf( pFile, "\nendmodule\n\n" );
    fclose( pFile );

    Vec_BitFree( vInvs );
    Vec_BitFree( vUsed );
}